

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
despot::Floor::ComputeShortestPath
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Floor *this,int start,int end)

{
  long lVar1;
  iterator __position;
  void *pvVar2;
  uint uVar3;
  Coord CVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  undefined1 *second;
  bool bVar8;
  int move;
  int local_64;
  double local_60;
  int local_54;
  ulong local_50;
  vector<int,std::allocator<int>> *local_48;
  double local_40;
  Coord local_38;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = 0;
  local_54 = end;
  local_48 = (vector<int,std::allocator<int>> *)__return_storage_ptr__;
  do {
    if (start == local_54) {
      return (vector<int,_std::allocator<int>_> *)
             (vector<int,std::allocator<int>> *)__return_storage_ptr__;
    }
    local_64 = 0;
    lVar1 = *(long *)&(this->dist_).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[start].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data;
    local_60 = *(double *)(lVar1 + (long)end * 8);
    local_40 = (double)(int)((ulong)((long)(this->cells_).
                                           super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->cells_).
                                          super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if ((local_60 != local_40) || (NAN(local_60) || NAN(local_40))) {
      second = Compass::DIRECTIONS;
      uVar7 = 0;
      do {
        local_38 = (this->cells_).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
                   _M_impl.super__Vector_impl_data._M_start[start];
        CVar4 = operator+(&local_38,(Coord *)second);
        __return_storage_ptr__ = (vector<int,_std::allocator<int>_> *)local_48;
        uVar3 = CVar4.x;
        iVar5 = start;
        if (((-1 < (int)uVar3) && (-1 < (long)CVar4)) && ((int)uVar3 < this->num_cols_)) {
          if ((CVar4.y < this->num_rows_) &&
             (this->floor_[(ulong)CVar4 >> 0x20][uVar3 & 0x7fffffff] != INVALID)) {
            piVar6 = &INVALID;
            if (((-1 < (int)uVar3) &&
                ((piVar6 = &INVALID, -1 < (long)CVar4 &&
                 (piVar6 = &INVALID, (int)uVar3 < this->num_cols_)))) &&
               (piVar6 = &INVALID, CVar4.y < this->num_rows_)) {
              piVar6 = this->floor_[(ulong)CVar4 >> 0x20] + (uVar3 & 0x7fffffff);
            }
            iVar5 = *piVar6;
          }
        }
        if (*(double *)
             (*(long *)&(this->dist_).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar5].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data + (long)end * 8) < local_60) {
          local_64 = (int)uVar7;
          start = iVar5;
          break;
        }
        second = (undefined1 *)((long)second + 8);
        bVar8 = uVar7 < 3;
        uVar7 = uVar7 + 1;
      } while (bVar8);
      __position._M_current = *(int **)(local_48 + 8);
      if (__position._M_current == *(int **)(local_48 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_48,__position,&local_64);
      }
      else {
        *__position._M_current = local_64;
        *(int **)(local_48 + 8) = __position._M_current + 1;
      }
    }
    else {
      local_50 = CONCAT71((int7)((ulong)lVar1 >> 8),1);
    }
    if ((local_60 == local_40) && (!NAN(local_60) && !NAN(local_40))) {
      if (((local_50 & 1) == 0) &&
         (pvVar2 = *(void **)__return_storage_ptr__, pvVar2 != (void *)0x0)) {
        operator_delete(pvVar2,(long)*(pointer *)((long)__return_storage_ptr__ + 0x10) -
                               (long)pvVar2);
      }
      return (vector<int,_std::allocator<int>_> *)
             (vector<int,std::allocator<int>> *)__return_storage_ptr__;
    }
  } while( true );
}

Assistant:

vector<int> Floor::ComputeShortestPath(int start, int end) const {
	int cur = start;
	vector<int> moves;
	while (cur != end) {
		int move = 0;
		double cur_dist = Distance(cur, end);

		if (cur_dist == NumCells()) {
			return moves;
		}

		for (int a = 0; a < 4; a++) {
			Coord pos = GetCell(cur) + Compass::DIRECTIONS[a];
			int next = cur;
			if (Inside(pos))
				next = GetIndex(pos);

			double dist = Distance(next, end);

			if (dist < cur_dist) {
				move = a;
				cur = next;
				break;
			}
		}
		moves.push_back(move);
	}
	return moves;
}